

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void ShowExampleAppLongText(bool *p_open)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int i_2;
  int i_1;
  ImGuiListClipper clipper;
  int i;
  ImGuiWindowFlags in_stack_00000374;
  bool *in_stack_00000378;
  char *in_stack_00000380;
  ImVec2 *in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ImVec2 *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  ImGuiListClipper *pIVar4;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  ImGuiListClipper *this;
  undefined4 in_stack_ffffffffffffff88;
  ImGuiStyleVar in_stack_ffffffffffffff94;
  ImVec2 local_68;
  uint local_60;
  ImGuiListClipper local_5c;
  ImVec2 local_40;
  undefined1 local_38 [20];
  ImVec2 local_24 [2];
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2(local_10,520.0,600.0);
  ImGui::SetNextWindowSize(local_10,4);
  bVar1 = ImGui::Begin(in_stack_00000380,in_stack_00000378,in_stack_00000374);
  if (bVar1) {
    if ((ShowExampleAppLongText(bool*)::log == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar2 != 0)) {
      ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x176ab8);
      __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
    }
    ImGui::Text("Printing unusually long amount of text.");
    ImGui::Combo(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    iVar2 = ShowExampleAppLongText::lines;
    uVar3 = ImGuiTextBuffer::size(&ShowExampleAppLongText::log);
    ImGui::Text("Buffer contents: %d lines, %d bytes",(ulong)(uint)iVar2,(ulong)uVar3);
    ImVec2::ImVec2(local_24,0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
    if (bVar1) {
      ImGuiTextBuffer::clear((ImGuiTextBuffer *)0x176b70);
      ShowExampleAppLongText::lines = 0;
    }
    ImGui::SameLine(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    ImVec2::ImVec2((ImVec2 *)(local_38 + 0xc),0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff58);
    if (bVar1) {
      for (local_38._8_4_ = 0; (int)local_38._8_4_ < 1000; local_38._8_4_ = local_38._8_4_ + 1) {
        ImGuiTextBuffer::appendf
                  (&ShowExampleAppLongText::log,"%i The quick brown fox jumps over the lazy dog\n",
                   (ulong)(uint)(ShowExampleAppLongText::lines + local_38._8_4_));
      }
      ShowExampleAppLongText::lines = ShowExampleAppLongText::lines + 1000;
    }
    this = (ImGuiListClipper *)local_38;
    ImVec2::ImVec2((ImVec2 *)this,0.0,0.0);
    ImGui::BeginChild(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      SUB41((uint)in_stack_ffffffffffffff64 >> 0x18,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffff60);
    if (ShowExampleAppLongText::test_type == 0) {
      ImGuiTextBuffer::begin
                ((ImGuiTextBuffer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      ImGuiTextBuffer::end
                ((ImGuiTextBuffer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      ImGui::TextUnformatted
                ((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (char *)in_stack_ffffffffffffff58);
    }
    else if (ShowExampleAppLongText::test_type == 1) {
      iVar2 = ShowExampleAppLongText::test_type;
      ImVec2::ImVec2(&local_40,0.0,0.0);
      ImGui::PushStyleVar(in_stack_ffffffffffffff94,
                          (ImVec2 *)CONCAT44(iVar2,in_stack_ffffffffffffff88));
      pIVar4 = &local_5c;
      ImGuiListClipper::ImGuiListClipper
                ((ImGuiListClipper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      ImGuiListClipper::Begin
                (this,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 SUB84(in_stack_ffffffffffffff78,0));
      while (bVar1 = ImGuiListClipper::Step
                               ((ImGuiListClipper *)CONCAT44(iVar2,in_stack_ffffffffffffff88)),
            bVar1) {
        for (local_60 = local_5c.DisplayStart; (int)local_60 < local_5c.DisplayEnd;
            local_60 = local_60 + 1) {
          ImGui::Text("%i The quick brown fox jumps over the lazy dog",(ulong)local_60);
        }
      }
      ImGui::PopStyleVar((int)((ulong)pIVar4 >> 0x20));
      ImGuiListClipper::~ImGuiListClipper(&local_5c);
    }
    else if (ShowExampleAppLongText::test_type == 2) {
      iVar2 = ShowExampleAppLongText::test_type;
      ImVec2::ImVec2(&local_68,0.0,0.0);
      ImGui::PushStyleVar(in_stack_ffffffffffffff94,
                          (ImVec2 *)CONCAT44(iVar2,in_stack_ffffffffffffff88));
      for (uVar3 = 0; (int)uVar3 < ShowExampleAppLongText::lines; uVar3 = uVar3 + 1) {
        ImGui::Text("%i The quick brown fox jumps over the lazy dog",(ulong)uVar3);
      }
      ImGui::PopStyleVar((int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    }
    ImGui::EndChild();
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppLongText(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(520,600), ImGuiCond_FirstUseEver);
    if (!ImGui::Begin("Example: Long text display", p_open))
    {
        ImGui::End();
        return;
    }

    static int test_type = 0;
    static ImGuiTextBuffer log;
    static int lines = 0;
    ImGui::Text("Printing unusually long amount of text.");
    ImGui::Combo("Test type", &test_type, "Single call to TextUnformatted()\0Multiple calls to Text(), clipped\0Multiple calls to Text(), not clipped (slow)\0");
    ImGui::Text("Buffer contents: %d lines, %d bytes", lines, log.size());
    if (ImGui::Button("Clear")) { log.clear(); lines = 0; }
    ImGui::SameLine();
    if (ImGui::Button("Add 1000 lines"))
    {
        for (int i = 0; i < 1000; i++)
            log.appendf("%i The quick brown fox jumps over the lazy dog\n", lines+i);
        lines += 1000;
    }
    ImGui::BeginChild("Log");
    switch (test_type)
    {
    case 0:
        // Single call to TextUnformatted() with a big buffer
        ImGui::TextUnformatted(log.begin(), log.end());
        break;
    case 1:
        {
            // Multiple calls to Text(), manually coarsely clipped - demonstrate how to use the ImGuiListClipper helper.
            ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
            ImGuiListClipper clipper;
            while (clipper.Step())
                for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
                    ImGui::Text("%i The quick brown fox jumps over the lazy dog", i);
            ImGui::PopStyleVar();
            break;
        }
    case 2:
        // Multiple calls to Text(), not clipped (slow)
        ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
        for (int i = 0; i < lines; i++)
            ImGui::Text("%i The quick brown fox jumps over the lazy dog", i);
        ImGui::PopStyleVar();
        break;
    }
    ImGui::EndChild();
    ImGui::End();
}